

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

Udata * luaS_newudata(lua_State *L,size_t s,int nuvalue)

{
  Udata *pUVar1;
  long local_58;
  long local_48;
  GCObject *o;
  int i;
  Udata *u;
  int nuvalue_local;
  size_t s_local;
  lua_State *L_local;
  
  if (nuvalue == 0) {
    local_48 = 0x20;
  }
  else {
    local_48 = (long)nuvalue * 0x10 + 0x28;
  }
  if (0x7fffffffffffffffU - local_48 < s) {
    luaM_toobig(L);
  }
  if (nuvalue == 0) {
    local_58 = 0x20;
  }
  else {
    local_58 = (long)nuvalue * 0x10 + 0x28;
  }
  pUVar1 = (Udata *)luaC_newobj(L,7,local_58 + s);
  pUVar1->len = s;
  pUVar1->nuvalue = (unsigned_short)nuvalue;
  pUVar1->metatable = (Table *)0x0;
  for (o._4_4_ = 0; o._4_4_ < nuvalue; o._4_4_ = o._4_4_ + 1) {
    *(undefined1 *)((long)pUVar1->uv + (long)o._4_4_ * 0x10 + 8) = 0;
  }
  return pUVar1;
}

Assistant:

Udata *luaS_newudata (lua_State *L, size_t s, int nuvalue) {
  Udata *u;
  int i;
  GCObject *o;
  if (l_unlikely(s > MAX_SIZE - udatamemoffset(nuvalue)))
    luaM_toobig(L);
  o = luaC_newobj(L, LUA_VUSERDATA, sizeudata(nuvalue, s));
  u = gco2u(o);
  u->len = s;
  u->nuvalue = nuvalue;
  u->metatable = NULL;
  for (i = 0; i < nuvalue; i++)
    setnilvalue(&u->uv[i].uv);
  return u;
}